

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O0

void Image_Function::Prewitt
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  char *message;
  uchar *puVar11;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  int32_t gY;
  int32_t gX;
  int32_t partialG;
  uint8_t *inXEnd;
  uint8_t *inX;
  uint8_t *outX;
  uint32_t yMinusX;
  uint32_t yPlusX;
  uint8_t *inYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  float multiplier;
  uint32_t gradientHeight;
  uint32_t gradientWidth;
  uint32_t endYOffset;
  uint32_t endXOffset;
  uint32_t startYOffset;
  uint32_t startXOffset;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff0c;
  FilterKernel<3U> *in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  ImageTemplate<unsigned_char> *this;
  uint32_t in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff48;
  uchar *local_a8;
  uint8_t *local_a0;
  uint8_t *local_88;
  uchar *local_80;
  
  uVar1 = in_stack_00000008;
  uVar8 = in_stack_00000010;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff28,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c
             ,in_stack_ffffffffffffff18,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  this = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff04,uVar8),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffefc,uVar1));
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff04,uVar8),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffefc,uVar1));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x119065);
  if ((2 < in_stack_00000008) && (2 < in_stack_00000010)) {
    uVar1 = (uint)(in_ESI != 0);
    uVar8 = (uint)(in_EDX != 0);
    uVar2 = in_ESI + in_stack_00000008 + 1;
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
    uVar4 = in_EDX + in_stack_00000010 + 1;
    uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
    sqrtf(2.0);
    uVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    uVar7 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
    local_80 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    local_80 = local_80 +
               (((ulong)in_ESI + (ulong)(((in_EDX + 1) - uVar8) * uVar6) + 1) - (ulong)uVar1);
    puVar11 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
    local_88 = puVar11 + (ulong)in_R8D + (ulong)(in_R9D * uVar7);
    puVar11 = local_80 + (in_stack_00000010 - ((uint)(uVar8 == 0) + (uint)(uVar5 <= uVar4))) * uVar6
    ;
    if (uVar8 == 0) {
      memset(local_88,0,(ulong)in_stack_00000008);
      local_88 = local_88 + uVar7;
    }
    uVar8 = uVar6 - 1;
    if ((Prewitt(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)
         ::kernel == '\0') &&
       (iVar9 = __cxa_guard_acquire(&Prewitt(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)
                                     ::kernel), iVar9 != 0)) {
      anon_unknown.dwarf_14732::FilterKernel<3U>::FilterKernel
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      __cxa_guard_release(&Prewitt(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)
                           ::kernel);
    }
    for (; local_80 != puVar11; local_80 = local_80 + uVar6) {
      local_a0 = local_88;
      if (uVar1 == 0) {
        *local_88 = '\0';
        local_a0 = local_88 + 1;
      }
      for (local_a8 = local_80;
          local_a8 != local_80 + (in_stack_00000008 - ((uint)(uVar1 == 0) + (uint)(uVar3 <= uVar2)))
          ; local_a8 = local_a8 + 1) {
        iVar9 = ((((uint)local_a8[-(ulong)(uVar6 + 1)] - (uint)local_a8[uVar6 + 1]) +
                  (uint)local_a8[-1] + (uint)local_a8[uVar8]) - (uint)local_a8[-(ulong)uVar8]) -
                (uint)local_a8[1];
        iVar10 = ((((uint)local_a8[-(ulong)(uVar6 + 1)] - (uint)local_a8[uVar6 + 1]) +
                   (uint)local_a8[-(ulong)uVar6] + (uint)local_a8[-(ulong)uVar8]) -
                 (uint)local_a8[uVar8]) - (uint)local_a8[uVar6];
        if (iVar9 < 0) {
          iVar9 = -iVar9;
        }
        if (iVar10 < 0) {
          iVar10 = -iVar10;
        }
        *local_a0 = Prewitt::kernel.kernel[iVar9][iVar10];
        local_a0 = local_a0 + 1;
      }
      if (uVar3 <= uVar2) {
        *local_a0 = '\0';
      }
      local_88 = local_88 + uVar7;
    }
    if (uVar5 <= uVar4) {
      memset(local_88,0,(ulong)in_stack_00000008);
    }
    return;
  }
  message = (char *)__cxa_allocate_exception(0x28);
  imageException::imageException((imageException *)this,message);
  __cxa_throw(message,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Prewitt( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                  uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( width < 3 || height < 3 )
            throw imageException( "Input image is very small for Sobel filter to be applied" );

        const uint32_t startXOffset = (startXIn > 0u) ? 1u : 0u;
        const uint32_t startYOffset = (startYIn > 0u) ? 1u : 0u;
        const uint32_t endXOffset   = ((startXIn + width  + 1u) < in.width ()) ? 1u : 0u;
        const uint32_t endYOffset   = ((startYIn + height + 1u) < in.height()) ? 1u : 0u;

        // Create the map of gradient values
        const uint32_t gradientWidth  = width  - ( ((startXOffset > 0u) ? 0u : 1u) + ((endXOffset > 0u) ? 0u : 1u) );
        const uint32_t gradientHeight = height - ( ((startYOffset > 0u) ? 0u : 1u) + ((endYOffset > 0u) ? 0u : 1u) );

        const float multiplier = 1.0f / ( 3.0f * sqrtf( 2.0f ) );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + (startYIn + 1u - startYOffset) * rowSizeIn + startXIn + 1u - startXOffset;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * inYEnd = inY + gradientHeight * rowSizeIn;

        if ( startYOffset == 0u ) {
            // fill top row with zeros
            memset( outY, 0, width );
            outY += rowSizeOut;
        }

        const uint32_t yPlusX  = rowSizeIn + 1u;
        const uint32_t yMinusX = rowSizeIn - 1u;

        static const FilterKernel<3u> kernel(multiplier);

        for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
            uint8_t       * outX   = outY;

            if ( startXOffset == 0u ) {
                // set first pixel in row to 0
                *outX = 0;
                ++outX;
            }

            const uint8_t * inX    = inY;
            const uint8_t * inXEnd = inX + gradientWidth;

            for( ; inX != inXEnd; ++inX, ++outX ) {
                //      | +1  0 -1|
                // Gx = | +1  0 -1|
                //      | +1  0 -1|

                //      | +1 +1 +1|
                // Gy = |  0  0  0|
                //      | -1 -1 -1|

                const int32_t partialG = static_cast<int32_t>(*(inX - yPlusX )) - *(inX + yPlusX );  // [y - 1; x - 1] - [y + 1; x + 1]

                const int32_t gX = partialG + *(inX - 1        ) + *(inX + yMinusX) - *(inX - yMinusX) - *(inX + 1        );
                const int32_t gY = partialG + *(inX - rowSizeIn) + *(inX - yMinusX) - *(inX + yMinusX) - *(inX + rowSizeIn);

                *outX = kernel.kernel[(gX < 0) ? -gX : gX][(gY < 0) ? -gY : gY];
            }

            if ( endXOffset == 0u ) {
                // set last pixel in row to 0
                *outX = 0;
            }
        }

        if ( endYOffset == 0u ) {
            // fill bottom row with zeros
            memset( outY, 0, width );
        }
    }